

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O3

void zlib_compress_block(ssh_compressor *sc,uchar *block,int len,uchar **outblock,int *outlen,
                        int minlen)

{
  ssh_compressor *psVar1;
  uchar uVar2;
  uchar uVar3;
  ssh_compression_alg *out;
  LZ77InternalContext *st;
  bool bVar4;
  strbuf *psVar5;
  ulong uVar6;
  long lVar7;
  short sVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  uchar *puVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uchar *puVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  uchar *puVar23;
  Match matches [32];
  uint local_17c;
  uint local_138 [66];
  
  out = sc[-3].vt;
  if ((strbuf *)out->name != (strbuf *)0x0) {
    __assert_fail("!out->outbuf",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/zlib.c",
                  0x269,
                  "void zlib_compress_block(ssh_compressor *, const unsigned char *, int, unsigned char **, int *, int)"
                 );
  }
  psVar1 = sc + -4;
  psVar5 = strbuf_new_nm();
  out->name = (char *)psVar5;
  if (*(_Bool *)((long)&out->compress_new + 4) == true) {
    outbits((Outbuf *)out,0x9c78,0x10);
    *(_Bool *)((long)&out->compress_new + 4) = false;
    outbits((Outbuf *)out,2,3);
  }
  st = (LZ77InternalContext *)psVar1->vt;
  uVar17 = st->npending;
  uVar6 = (ulong)uVar17;
  if (3 < (int)uVar17) {
    __assert_fail("st->npending <= HASHCHARS",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/zlib.c",
                  0xba,"void lz77_compress(struct LZ77Context *, const unsigned char *, int)");
  }
  if ((int)uVar17 < 1) {
    lVar10 = 0;
  }
  else {
    puVar19 = st->pending;
    lVar10 = 0;
    puVar23 = block;
    do {
      uVar17 = (uint)uVar6;
      if ((int)((len - (int)lVar10) + uVar17) < 3) {
        if ((int)lVar10 < (int)uVar17) {
          lVar7 = 0;
          lVar9 = lVar10;
          do {
            st->pending[lVar7] = st->pending[lVar9];
            lVar9 = lVar9 + 1;
            uVar17 = st->npending;
            lVar7 = lVar7 + 1;
          } while (lVar9 < (int)uVar17);
        }
        break;
      }
      lVar9 = 0;
      do {
        puVar12 = puVar23 + -(long)(int)uVar17;
        if (lVar10 + lVar9 < (long)(int)uVar17) {
          puVar12 = puVar19;
        }
        *(uchar *)((long)local_138 + lVar9) = puVar12[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      lz77_advance(st,(uchar)local_138[0],
                   ((local_138[0] >> 0x10 & 0xff) * 0x10d +
                   (local_138[0] >> 8 & 0xff) * 0x107 +
                   (uint)CONCAT11((uchar)local_138[0],(uchar)local_138[0])) % 0x7f7);
      lVar10 = lVar10 + 1;
      uVar17 = st->npending;
      uVar6 = (ulong)(int)uVar17;
      puVar23 = puVar23 + 1;
      puVar19 = puVar19 + 1;
    } while (lVar10 < (long)uVar6);
  }
  st->npending = uVar17 - (int)lVar10;
  if (0 < len) {
    uVar2 = '\0';
    local_17c = 0;
    iVar21 = 0;
    do {
      if (((uint)len < 3) ||
         (sVar8 = st->hashtab
                  [((uint)block[2] * 0x10d + (uint)block[1] * 0x107 + (uint)CONCAT11(*block,*block))
                   % 0x7f7].first, sVar8 == -1)) {
LAB_0012f2b7:
        if (iVar21 < 1) {
          (*(code *)sc[-2].vt)(psVar1,*block);
          iVar22 = 1;
          goto LAB_0012f379;
        }
LAB_0012f333:
        (*(code *)sc[-1].vt)(psVar1,local_17c,iVar21);
        iVar22 = iVar21 + -1;
        if (iVar22 != 0) {
          iVar21 = 0;
          goto LAB_0012f379;
        }
        iVar21 = 0;
        uVar17 = len;
      }
      else {
        iVar22 = st->winpos;
        uVar17 = 0;
        do {
          iVar11 = sVar8 - iVar22;
          uVar18 = iVar11 + 0xffff;
          if (-1 < (int)(iVar11 + 0x8000U)) {
            uVar18 = iVar11 + 0x8000U;
          }
          iVar11 = iVar11 - (uVar18 & 0xffff8000);
          iVar15 = iVar11 + 0x8000;
          lVar10 = 0;
          do {
            uVar18 = iVar11 + (int)lVar10;
            puVar19 = block + uVar18;
            if ((int)uVar18 < 0) {
              puVar19 = st->data + (iVar22 + iVar15 + (int)lVar10 & 0x7fff);
            }
            if (block[lVar10] != *puVar19) goto LAB_0012f220;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          local_138[(long)(int)uVar17 * 2] = 0x8000 - iVar15;
          local_138[(long)(int)uVar17 * 2 + 1] = 3;
          uVar18 = uVar17 + 1;
          bVar4 = 0x1e < (int)uVar17;
          uVar17 = uVar18;
          if (bVar4) goto LAB_0012f23a;
LAB_0012f220:
          sVar8 = st->win[sVar8].next;
        } while (sVar8 != -1);
        uVar18 = uVar17;
        if ((int)uVar17 < 1) goto LAB_0012f2b7;
LAB_0012f23a:
        uVar6 = 3;
        if (3 < len) {
          uVar6 = (ulong)(uint)len;
        }
        uVar13 = 3;
        do {
          uVar20 = uVar6;
          if ((uVar13 == uVar6) || (uVar20 = uVar13 & 0xffffffff, (int)uVar18 < 1)) break;
          uVar14 = (ulong)uVar18;
          uVar16 = 0;
          uVar18 = 0;
          do {
            uVar17 = (int)uVar13 - local_138[uVar16 * 2];
            puVar19 = block + uVar17;
            if ((int)uVar17 < 0) {
              puVar19 = st->data + (uVar17 + iVar22 & 0x7fff);
            }
            if (block[uVar13] == *puVar19) {
              lVar10 = (long)(int)uVar18;
              uVar18 = uVar18 + 1;
              *(undefined8 *)(local_138 + lVar10 * 2) = *(undefined8 *)(local_138 + uVar16 * 2);
            }
            uVar16 = uVar16 + 1;
          } while (uVar14 != uVar16);
          uVar13 = uVar13 + 1;
        } while (uVar18 != 0);
        iVar11 = (int)uVar20;
        local_138[1] = iVar11;
        if (0 < iVar21) {
          if (iVar21 + 1 < iVar11) {
            (*(code *)sc[-2].vt)(psVar1,uVar2);
            local_17c = local_138[0];
            uVar2 = *block;
            iVar22 = 1;
            iVar21 = iVar11;
            goto LAB_0012f379;
          }
          goto LAB_0012f333;
        }
        local_17c = local_138[0];
        uVar2 = *block;
        iVar22 = 1;
        iVar21 = iVar11;
LAB_0012f379:
        uVar17 = len - iVar22;
        iVar22 = iVar22 + 1;
        do {
          if (len < 3) {
            iVar11 = st->npending;
            if (2 < (long)iVar11) {
              __assert_fail("st->npending < HASHCHARS",
                            "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/zlib.c"
                            ,0x140,
                            "void lz77_compress(struct LZ77Context *, const unsigned char *, int)");
            }
            uVar3 = *block;
            st->npending = iVar11 + 1;
            st->pending[iVar11] = uVar3;
          }
          else {
            uVar3 = *block;
            lz77_advance(st,uVar3,((uint)block[2] * 0x10d +
                                  (uint)block[1] * 0x107 + (uint)CONCAT11(uVar3,uVar3)) % 0x7f7);
          }
          block = block + 1;
          len = len - 1;
          iVar22 = iVar22 + -1;
        } while (1 < iVar22);
      }
      len = uVar17;
    } while (0 < len);
  }
  outbits((Outbuf *)out,0,7);
  outbits((Outbuf *)out,2,10);
  outbits((Outbuf *)out,2,3);
  while( true ) {
    psVar5 = (strbuf *)out->name;
    uVar6 = psVar5->len;
    if ((ulong)(long)minlen <= uVar6) break;
    outbits((Outbuf *)out,0,7);
    outbits((Outbuf *)out,2,3);
  }
  *outlen = (int)uVar6;
  puVar19 = (uchar *)strbuf_to_str(psVar5);
  *outblock = puVar19;
  out->name = (char *)0x0;
  return;
}

Assistant:

void zlib_compress_block(ssh_compressor *sc,
                         const unsigned char *block, int len,
                         unsigned char **outblock, int *outlen,
                         int minlen)
{
    struct ssh_zlib_compressor *comp =
        container_of(sc, struct ssh_zlib_compressor, sc);
    struct Outbuf *out = (struct Outbuf *) comp->ectx.userdata;
    bool in_block;

    assert(!out->outbuf);
    out->outbuf = strbuf_new_nm();

    /*
     * If this is the first block, output the Zlib (RFC1950) header
     * bytes 78 9C. (Deflate compression, 32K window size, default
     * algorithm.)
     */
    if (out->firstblock) {
        outbits(out, 0x9C78, 16);
        out->firstblock = false;

        in_block = false;
    } else
        in_block = true;

    if (!in_block) {
        /*
         * Start a Deflate (RFC1951) fixed-trees block. We
         * transmit a zero bit (BFINAL=0), followed by a zero
         * bit and a one bit (BTYPE=01). Of course these are in
         * the wrong order (01 0).
         */
        outbits(out, 2, 3);
    }

    /*
     * Do the compression.
     */
    lz77_compress(&comp->ectx, block, len);

    /*
     * End the block (by transmitting code 256, which is
     * 0000000 in fixed-tree mode), and transmit some empty
     * blocks to ensure we have emitted the byte containing the
     * last piece of genuine data. There are three ways we can
     * do this:
     *
     *  - Minimal flush. Output end-of-block and then open a
     *    new static block. This takes 9 bits, which is
     *    guaranteed to flush out the last genuine code in the
     *    closed block; but allegedly zlib can't handle it.
     *
     *  - Zlib partial flush. Output EOB, open and close an
     *    empty static block, and _then_ open the new block.
     *    This is the best zlib can handle.
     *
     *  - Zlib sync flush. Output EOB, then an empty
     *    _uncompressed_ block (000, then sync to byte
     *    boundary, then send bytes 00 00 FF FF). Then open the
     *    new block.
     *
     * For the moment, we will use Zlib partial flush.
     */
    outbits(out, 0, 7);        /* close block */
    outbits(out, 2, 3 + 7);    /* empty static block */
    outbits(out, 2, 3);        /* open new block */

    /*
     * If we've been asked to pad out the compressed data until it's
     * at least a given length, do so by emitting further empty static
     * blocks.
     */
    while (out->outbuf->len < minlen) {
        outbits(out, 0, 7);            /* close block */
        outbits(out, 2, 3);            /* open new static block */
    }

    *outlen = out->outbuf->len;
    *outblock = (unsigned char *)strbuf_to_str(out->outbuf);
    out->outbuf = NULL;
}